

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

bool __thiscall CS248::Shader::setScalarParameter(Shader *this,string *paramName,int value)

{
  GLuint GVar1;
  PFNGLGETUNIFORMLOCATIONPROC p_Var2;
  GLint GVar3;
  GLchar *pGVar4;
  GLint in_EDX;
  long in_RDI;
  int uniformLocation;
  bool success;
  
  p_Var2 = __glewGetUniformLocation;
  GVar1 = *(GLuint *)(in_RDI + 0x50);
  pGVar4 = (GLchar *)std::__cxx11::string::c_str();
  GVar3 = (*p_Var2)(GVar1,pGVar4);
  if (-1 < GVar3) {
    (*__glewUniform1i)(GVar3,in_EDX);
  }
  return -1 < GVar3;
}

Assistant:

bool Shader::setScalarParameter(const std::string& paramName, int value) {

    bool success = true;
    int uniformLocation = glGetUniformLocation(programId_.id, paramName.c_str());

    if (uniformLocation >= 0)
        glUniform1i(uniformLocation, value);
    else
        success = false;

    return success;
}